

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

void __thiscall
onmt::Tokenizer::annotate_tokens
          (Tokenizer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *features,vector<onmt::Token,_std::allocator<onmt::Token>_> *tokens)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *in_RDI;
  undefined1 in_stack_ffffffffffffff9f;
  string *text;
  Tokenizer *in_stack_ffffffffffffffb0;
  string local_40 [2];
  
  text = local_40;
  (**(code **)&((in_RDI->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                super__Vector_impl_data._M_start)->join_left)(text,in_RDI,in_RSI,in_RDX);
  tokenize(in_stack_ffffffffffffffb0,text,in_RDI,(bool)in_stack_ffffffffffffff9f);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Tokenizer::annotate_tokens(const std::vector<std::string>& words,
                                  const std::vector<std::vector<std::string>>& features,
                                  std::vector<Token>& tokens) const
  {
    tokenize(detokenize(words, features), tokens, /*training=*/false);
  }